

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

bool fmt::v8::detail::
     write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long,char8_t>
               (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> *out,unsigned_long value,
               uint prefix,basic_format_specs<char8_t> *specs,locale_ref loc)

{
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar1;
  undefined1 local_58 [8];
  digit_grouping<char8_t> grouping;
  basic_format_specs<char8_t> *specs_local;
  uint prefix_local;
  unsigned_long value_local;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> *out_local;
  locale_ref loc_local;
  
  grouping.sep_._32_8_ = specs;
  digit_grouping<char8_t>::digit_grouping((digit_grouping<char8_t> *)local_58,loc,true);
  bVar1 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned_long,char8_t>
                    (out->container,value,prefix,(basic_format_specs<char8_t> *)grouping.sep_._32_8_
                     ,(digit_grouping<char8_t> *)local_58);
  out->container = (buffer<char8_t> *)bVar1;
  digit_grouping<char8_t>::~digit_grouping((digit_grouping<char8_t> *)local_58);
  return true;
}

Assistant:

auto write_int_localized(OutputIt& out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs, locale_ref loc)
    -> bool {
  auto grouping = digit_grouping<Char>(loc);
  out = write_int_localized(out, value, prefix, specs, grouping);
  return true;
}